

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preproc.c
# Opt level: O0

void identifier_add_char(identifier_t *identifier,char c)

{
  char c_local;
  identifier_t *identifier_local;
  
  if (0xff < identifier->length + 1) {
    fprintf(_stderr,"Identifier %s is too long, aborting!\n",identifier);
    exit(1);
  }
  identifier->name[identifier->length] = c;
  identifier->length = identifier->length + 1;
  identifier->name[identifier->length] = '\0';
  return;
}

Assistant:

static void identifier_add_char(identifier_t *identifier, char c) {
	if (identifier->length + 1 >= MAX_IDENTIFIER_LENGTH) {
		fprintf(stderr, "Identifier %s is too long, aborting!\n", identifier->name);
		exit(1);
	}

	identifier->name[identifier->length] = c;
	identifier->length++;
	identifier->name[identifier->length] = 0;
}